

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::c_formatter<spdlog::details::null_scoped_padder>::format
          (c_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  char *buf_ptr;
  char *pcVar8;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_01;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  char acStack_33 [3];
  char *local_30;
  
  pcVar6 = *(char **)(days + (long)tm_time->tm_wday * 8);
  sVar5 = strlen(pcVar6);
  fmt::v6::internal::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar6,pcVar6 + sVar5);
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  pcVar6 = *(char **)(months + (long)tm_time->tm_mon * 8);
  sVar5 = strlen(pcVar6);
  fmt::v6::internal::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar6,pcVar6 + sVar5);
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  uVar1 = tm_time->tm_mday;
  uVar4 = -uVar1;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  pcVar6 = fmt::v6::format_int::format_decimal((format_int *)&stack0xffffffffffffffb8,(ulong)uVar4);
  local_30 = pcVar6;
  if ((int)uVar1 < 0) {
    local_30 = pcVar6 + -1;
    pcVar6[-1] = '-';
  }
  if (-0x16 < (long)(&stack0xffffffffffffffb8 + -(long)local_30)) {
    fmt::v6::internal::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_30,
               local_30 + (long)(&stack0xffffffffffffffb8 + -(long)local_30 + 0x15));
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = ' ';
    uVar1 = tm_time->tm_hour;
    pcVar6 = (char *)(ulong)uVar1;
    if (pcVar6 < (char *)0x64) {
      uVar7 = (ulong)pcVar6 / 10;
      pcVar6 = in_stack_ffffffffffffffb8;
      if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        pcVar6 = in_stack_ffffffffffffffb8;
      }
      sVar3 = (dest->super_buffer<char>).size_;
      (dest->super_buffer<char>).size_ = sVar3 + 1;
      (dest->super_buffer<char>).ptr_[sVar3] = (byte)uVar7 | 0x30;
      if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      }
      sVar3 = (dest->super_buffer<char>).size_;
      (dest->super_buffer<char>).size_ = sVar3 + 1;
      (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
    }
    else {
      args.field_1.values_ =
           (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
            *)&stack0xffffffffffffffb8;
      args.types_ = 2;
      format_str.size_ = 5;
      format_str.data_ = "{:02}";
      fmt::v6::
      vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                ((range)dest,format_str,args,(locale_ref)0x0);
    }
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = ':';
    uVar1 = tm_time->tm_min;
    pcVar8 = (char *)(ulong)uVar1;
    if (pcVar8 < (char *)0x64) {
      uVar7 = (ulong)pcVar8 / 10;
      pcVar8 = pcVar6;
      if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        pcVar8 = pcVar6;
      }
      sVar3 = (dest->super_buffer<char>).size_;
      (dest->super_buffer<char>).size_ = sVar3 + 1;
      (dest->super_buffer<char>).ptr_[sVar3] = (byte)uVar7 | 0x30;
      if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      }
      sVar3 = (dest->super_buffer<char>).size_;
      (dest->super_buffer<char>).size_ = sVar3 + 1;
      (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
    }
    else {
      args_00.field_1.values_ =
           (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
            *)&stack0xffffffffffffffb8;
      args_00.types_ = 2;
      format_str_00.size_ = 5;
      format_str_00.data_ = "{:02}";
      fmt::v6::
      vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                ((range)dest,format_str_00,args_00,(locale_ref)0x0);
    }
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = ':';
    uVar1 = tm_time->tm_sec;
    in_stack_ffffffffffffffb8 = (char *)(ulong)uVar1;
    if (in_stack_ffffffffffffffb8 < (char *)0x64) {
      uVar7 = (ulong)in_stack_ffffffffffffffb8 / 10;
      in_stack_ffffffffffffffb8 = pcVar8;
      if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        in_stack_ffffffffffffffb8 = pcVar8;
      }
      sVar3 = (dest->super_buffer<char>).size_;
      (dest->super_buffer<char>).size_ = sVar3 + 1;
      (dest->super_buffer<char>).ptr_[sVar3] = (byte)uVar7 | 0x30;
      if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      }
      sVar3 = (dest->super_buffer<char>).size_;
      (dest->super_buffer<char>).size_ = sVar3 + 1;
      (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
    }
    else {
      args_01.field_1.values_ =
           (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
            *)&stack0xffffffffffffffb8;
      args_01.types_ = 2;
      format_str_01.size_ = 5;
      format_str_01.data_ = "{:02}";
      fmt::v6::
      vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                ((range)dest,format_str_01,args_01,(locale_ref)0x0);
    }
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = ' ';
    iVar2 = tm_time->tm_year;
    uVar1 = iVar2 + 0x76c;
    uVar4 = -uVar1;
    if (0 < (int)uVar1) {
      uVar4 = uVar1;
    }
    pcVar6 = fmt::v6::format_int::format_decimal
                       ((format_int *)&stack0xffffffffffffffb8,(ulong)uVar4);
    local_30 = pcVar6;
    if (iVar2 < -0x76c) {
      local_30 = pcVar6 + -1;
      pcVar6[-1] = '-';
    }
    if (-0x16 < (long)(&stack0xffffffffffffffb8 + -(long)local_30)) {
      fmt::v6::internal::buffer<char>::append<char>
                (&dest->super_buffer<char>,local_30,
                 local_30 + (long)(&stack0xffffffffffffffb8 + -(long)local_30 + 0x15));
      return;
    }
  }
  fmt::v6::internal::assert_fail(in_stack_ffffffffffffffc0,0,in_stack_ffffffffffffffb8);
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }